

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

OutputDeclaration * __thiscall
soul::ModuleCloner::getRemappedOutput(ModuleCloner *this,OutputDeclaration *old)

{
  mapped_type *this_00;
  OutputDeclaration *pOVar1;
  pool_ref<const_soul::heart::OutputDeclaration> local_20;
  OutputDeclaration *local_18;
  OutputDeclaration *old_local;
  ModuleCloner *this_local;
  
  local_18 = old;
  old_local = (OutputDeclaration *)this;
  pool_ref<soul::heart::OutputDeclaration_const>::pool_ref<soul::heart::OutputDeclaration,void>
            ((pool_ref<soul::heart::OutputDeclaration_const> *)&local_20,old);
  this_00 = std::
            unordered_map<soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>,_std::hash<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::equal_to<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>_>_>_>
            ::operator[](&this->outputMappings,(key_type *)&local_20);
  pOVar1 = pool_ptr<soul::heart::OutputDeclaration>::operator*(this_00);
  pool_ref<const_soul::heart::OutputDeclaration>::~pool_ref(&local_20);
  return pOVar1;
}

Assistant:

heart::OutputDeclaration& getRemappedOutput (heart::OutputDeclaration& old) { return *outputMappings[old]; }